

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::DEC_ZP_X(CPU *this)

{
  uint8_t uVar1;
  byte bVar2;
  byte data;
  
  this->cycles = 6;
  uVar1 = GetByte(this);
  bVar2 = uVar1 + this->X;
  uVar1 = ReadByte(this,(ushort)bVar2);
  data = uVar1 - 1;
  this->cycles = this->cycles - 2;
  WriteByte(this,(ushort)bVar2,data);
  (this->field_6).ps = data & 0x80 | (data == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::DEC_ZP_X()
{
    cycles = 6;
    uint8_t addr = GetByte() + X, result = ReadByte(addr) - 1;
    cycles -= 2;
    WriteByte(addr, result);
    Z = (result == 0);
    N = (result & 0b10000000) > 0;
}